

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_test.c
# Opt level: O0

void test_set_out_of_range(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  uint32_t id;
  int x;
  nni_id_map m;
  
  nni_id_map_init((nni_id_map *)&id,10,0xd,false);
  nVar1 = nni_id_set((nni_id_map *)&id,1,&result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,0xb0,"%s: expected success, got %s (%d)","nni_id_set(&m, 1, &x)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nni_id_set((nni_id_map *)&id,100,&result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,0xb1,"%s: expected success, got %s (%d)","nni_id_set(&m, 100, &x)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nni_id_alloc32((nni_id_map *)&id,&result__1,&result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                         ,0xb2,"%s: expected success, got %s (%d)","nni_id_alloc32(&m, &id, &x)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(result__1 == NNG_EADDRINUSE),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                 ,0xb3,"%s","id == 10");
  nni_id_map_fini((nni_id_map *)&id);
  return;
}

Assistant:

void
test_set_out_of_range(void)
{
	nni_id_map m;
	int        x;
	uint32_t   id;

	nni_id_map_init(&m, 10, 13, false);

	// We can insert outside the range forcibly.
	NUTS_PASS(nni_id_set(&m, 1, &x));
	NUTS_PASS(nni_id_set(&m, 100, &x));
	NUTS_PASS(nni_id_alloc32(&m, &id, &x));
	NUTS_TRUE(id == 10);
	nni_id_map_fini(&m);
}